

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O2

void Imf_2_5::anon_unknown_3::csc709Forward64(float *comp0,float *comp1,float *comp2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    fVar1 = comp0[lVar4];
    fVar2 = comp1[lVar4];
    fVar3 = comp2[lVar4];
    comp0[lVar4] = fVar3 * 0.0722 + fVar1 * 0.2126 + fVar2 * 0.7152;
    comp1[lVar4] = fVar3 * 0.5 + fVar1 * -0.1146 + fVar2 * -0.3854;
    comp2[lVar4] = fVar3 * -0.0458 + fVar1 * 0.5 + fVar2 * -0.4542;
  }
  return;
}

Assistant:

void
csc709Forward64 (float *comp0, float *comp1, float *comp2)
{
    float src[3];

    for (int i = 0; i<64; ++i)
    {
        src[0] = comp0[i];    
        src[1] = comp1[i]; 
        src[2] = comp2[i];     

        comp0[i] =  0.2126f * src[0] + 0.7152f * src[1] + 0.0722f * src[2];
        comp1[i] = -0.1146f * src[0] - 0.3854f * src[1] + 0.5000f * src[2];
        comp2[i] =  0.5000f * src[0] - 0.4542f * src[1] - 0.0458f * src[2];
    }
}